

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O3

void old_swap_nifti_header(nifti_1_header *h,int is_nifti)

{
  short *psVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  undefined1 auVar7 [16];
  int iVar8;
  float fVar9;
  uint uVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  short sVar17;
  short sVar18;
  short sVar19;
  short sVar20;
  short sVar21;
  short sVar22;
  short sVar23;
  short sVar24;
  short sVar25;
  short sVar26;
  undefined1 auVar27 [15];
  undefined1 auVar28 [15];
  undefined1 auVar29 [15];
  undefined1 auVar30 [15];
  undefined1 auVar31 [15];
  undefined1 auVar32 [15];
  undefined1 auVar33 [15];
  undefined1 auVar34 [15];
  undefined1 auVar35 [15];
  undefined1 auVar36 [15];
  undefined1 auVar37 [15];
  undefined1 auVar38 [15];
  undefined1 auVar39 [15];
  undefined1 auVar40 [15];
  undefined1 auVar41 [15];
  undefined1 auVar42 [15];
  undefined1 auVar43 [15];
  undefined1 auVar44 [15];
  undefined1 auVar45 [15];
  undefined1 auVar46 [15];
  undefined1 auVar47 [15];
  undefined1 auVar48 [15];
  undefined1 auVar49 [15];
  undefined1 auVar50 [15];
  undefined1 auVar51 [15];
  undefined1 auVar52 [15];
  undefined1 auVar53 [15];
  undefined1 auVar54 [15];
  undefined1 auVar55 [15];
  undefined1 auVar56 [15];
  undefined1 auVar57 [15];
  undefined1 auVar58 [15];
  undefined1 auVar59 [15];
  undefined1 auVar60 [15];
  undefined1 auVar61 [15];
  undefined1 auVar62 [15];
  undefined1 auVar63 [15];
  undefined1 auVar64 [15];
  undefined1 auVar65 [15];
  undefined1 auVar66 [15];
  undefined1 auVar67 [15];
  undefined1 auVar68 [15];
  undefined1 auVar69 [15];
  undefined1 auVar70 [15];
  undefined1 auVar71 [15];
  undefined1 auVar72 [15];
  undefined1 auVar73 [15];
  undefined1 auVar74 [15];
  undefined1 auVar75 [15];
  undefined1 auVar76 [15];
  undefined1 auVar77 [15];
  undefined1 auVar78 [15];
  undefined1 auVar79 [15];
  undefined1 auVar80 [15];
  undefined1 auVar81 [15];
  undefined1 auVar82 [15];
  undefined1 auVar83 [15];
  undefined1 auVar84 [15];
  undefined1 auVar85 [15];
  undefined1 auVar86 [15];
  size_t ii;
  long lVar87;
  undefined1 auVar88 [16];
  undefined4 uVar89;
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  
  iVar8 = h->sizeof_hdr;
  auVar88 = ZEXT716(CONCAT52(CONCAT41((int)(CONCAT34((int3)(CONCAT25((short)(((uint7)(byte)((uint)
                                                  iVar8 >> 0x18) << 0x30) >> 0x28),
                                                  CONCAT14((char)((uint)iVar8 >> 0x10),iVar8)) >>
                                                  0x20),iVar8) >> 0x18),(char)((uint)iVar8 >> 8)),
                             (ushort)(byte)iVar8) & 0xffffff00ffffff);
  auVar88 = pshuflw(auVar88,auVar88,0x1b);
  sVar11 = auVar88._0_2_;
  sVar12 = auVar88._2_2_;
  sVar13 = auVar88._4_2_;
  sVar14 = auVar88._6_2_;
  h->sizeof_hdr =
       CONCAT13((0 < sVar14) * (sVar14 < 0x100) * auVar88[6] - (0xff < sVar14),
                CONCAT12((0 < sVar13) * (sVar13 < 0x100) * auVar88[4] - (0xff < sVar13),
                         CONCAT11((0 < sVar12) * (sVar12 < 0x100) * auVar88[2] - (0xff < sVar12),
                                  (0 < sVar11) * (sVar11 < 0x100) * auVar88[0] - (0xff < sVar11))));
  lVar87 = 0;
  do {
    psVar1 = h->dim + lVar87;
    *psVar1 = *psVar1 << 8 | (ushort)*psVar1 >> 8;
    lVar87 = lVar87 + 1;
  } while (lVar87 != 8);
  lVar87 = 0;
  do {
    fVar9 = h->pixdim[lVar87];
    auVar88._8_8_ = 0;
    auVar88._0_8_ =
         (ulong)CONCAT52((int5)(CONCAT43((int)(CONCAT34((int3)(CONCAT25((short)(((uint7)(byte)((uint
                                                  )fVar9 >> 0x18) << 0x30) >> 0x28),
                                                  CONCAT14((char)((uint)fVar9 >> 0x10),fVar9)) >>
                                                  0x20),fVar9) >> 0x18),
                                         CONCAT12((char)((uint)fVar9 >> 8),SUB42(fVar9,0))) >> 0x10)
                         ,SUB42(fVar9,0)) & 0xffff00ff00ff00ff;
    auVar88 = pshuflw(auVar88,auVar88,0x1b);
    sVar11 = auVar88._0_2_;
    sVar12 = auVar88._2_2_;
    sVar13 = auVar88._4_2_;
    sVar14 = auVar88._6_2_;
    h->pixdim[lVar87] =
         (float)CONCAT13((0 < sVar14) * (sVar14 < 0x100) * auVar88[6] - (0xff < sVar14),
                         CONCAT12((0 < sVar13) * (sVar13 < 0x100) * auVar88[4] - (0xff < sVar13),
                                  CONCAT11((0 < sVar12) * (sVar12 < 0x100) * auVar88[2] -
                                           (0xff < sVar12),
                                           (0 < sVar11) * (sVar11 < 0x100) * auVar88[0] -
                                           (0xff < sVar11))));
    lVar87 = lVar87 + 1;
  } while (lVar87 != 8);
  uVar10._0_2_ = h->datatype;
  uVar10._2_2_ = h->bitpix;
  auVar88 = psllw(ZEXT416(uVar10),8);
  uVar10 = auVar88._0_4_ | CONCAT22((ushort)uVar10._2_2_ >> 8,(ushort)(undefined2)uVar10 >> 8);
  h->datatype = (short)uVar10;
  h->bitpix = (short)(uVar10 >> 0x10);
  fVar9 = h->vox_offset;
  auVar102._8_8_ = 0;
  auVar102._0_8_ =
       (ulong)CONCAT52((int5)(CONCAT43((int)(CONCAT34((int3)(CONCAT25((short)(((uint7)(byte)((uint)
                                                  fVar9 >> 0x18) << 0x30) >> 0x28),
                                                  CONCAT14((char)((uint)fVar9 >> 0x10),fVar9)) >>
                                                  0x20),fVar9) >> 0x18),
                                       CONCAT12((char)((uint)fVar9 >> 8),SUB42(fVar9,0))) >> 0x10),
                       SUB42(fVar9,0)) & 0xffff00ff00ff00ff;
  auVar88 = pshuflw(auVar102,auVar102,0x1b);
  sVar11 = auVar88._0_2_;
  sVar12 = auVar88._2_2_;
  sVar13 = auVar88._4_2_;
  sVar14 = auVar88._6_2_;
  h->vox_offset =
       (float)CONCAT13((0 < sVar14) * (sVar14 < 0x100) * auVar88[6] - (0xff < sVar14),
                       CONCAT12((0 < sVar13) * (sVar13 < 0x100) * auVar88[4] - (0xff < sVar13),
                                CONCAT11((0 < sVar12) * (sVar12 < 0x100) * auVar88[2] -
                                         (0xff < sVar12),
                                         (0 < sVar11) * (sVar11 < 0x100) * auVar88[0] -
                                         (0xff < sVar11))));
  uVar2._0_4_ = h->cal_max;
  uVar2._4_4_ = h->cal_min;
  auVar27._8_6_ = 0;
  auVar27._0_8_ = uVar2;
  auVar27[0xe] = (char)((uint)uVar2._4_4_ >> 0x18);
  auVar33._8_4_ = 0;
  auVar33._0_8_ = uVar2;
  auVar33[0xc] = (char)((uint)uVar2._4_4_ >> 0x10);
  auVar33._13_2_ = auVar27._13_2_;
  auVar39._8_4_ = 0;
  auVar39._0_8_ = uVar2;
  auVar39._12_3_ = auVar33._12_3_;
  auVar45._8_2_ = 0;
  auVar45._0_8_ = uVar2;
  auVar45[10] = (char)((uint)uVar2._4_4_ >> 8);
  auVar45._11_4_ = auVar39._11_4_;
  auVar51._8_2_ = 0;
  auVar51._0_8_ = uVar2;
  auVar51._10_5_ = auVar45._10_5_;
  auVar57[8] = (char)uVar2._4_4_;
  auVar57._0_8_ = uVar2;
  auVar57._9_6_ = auVar51._9_6_;
  auVar69._7_8_ = 0;
  auVar69._0_7_ = auVar57._8_7_;
  auVar75._1_8_ = SUB158(auVar69 << 0x40,7);
  auVar75[0] = (char)((uint)(undefined4)uVar2 >> 0x18);
  auVar75._9_6_ = 0;
  auVar76._1_10_ = SUB1510(auVar75 << 0x30,5);
  auVar76[0] = (char)((uint)(undefined4)uVar2 >> 0x10);
  auVar76._11_4_ = 0;
  auVar63[2] = (char)((uint)(undefined4)uVar2 >> 8);
  auVar63._0_2_ = (ushort)(undefined4)uVar2;
  auVar63._3_12_ = SUB1512(auVar76 << 0x20,3);
  auVar90._0_2_ = (ushort)(undefined4)uVar2 & 0xff;
  auVar90._2_13_ = auVar63._2_13_;
  auVar90[0xf] = 0;
  auVar88 = pshuflw(auVar90,auVar90,0x1b);
  auVar88 = pshufhw(auVar88,auVar88,0x1b);
  sVar11 = auVar88._0_2_;
  sVar12 = auVar88._2_2_;
  sVar13 = auVar88._4_2_;
  sVar14 = auVar88._6_2_;
  uVar89 = CONCAT13((0 < sVar14) * (sVar14 < 0x100) * auVar88[6] - (0xff < sVar14),
                    CONCAT12((0 < sVar13) * (sVar13 < 0x100) * auVar88[4] - (0xff < sVar13),
                             CONCAT11((0 < sVar12) * (sVar12 < 0x100) * auVar88[2] - (0xff < sVar12)
                                      ,(0 < sVar11) * (sVar11 < 0x100) * auVar88[0] -
                                       (0xff < sVar11))));
  sVar11 = auVar88._8_2_;
  sVar12 = auVar88._10_2_;
  sVar13 = auVar88._12_2_;
  sVar14 = auVar88._14_2_;
  h->cal_max = (float)uVar89;
  h->cal_min = (float)(int)(CONCAT17((0 < sVar14) * (sVar14 < 0x100) * auVar88[0xe] -
                                     (0xff < sVar14),
                                     CONCAT16((0 < sVar13) * (sVar13 < 0x100) * auVar88[0xc] -
                                              (0xff < sVar13),
                                              CONCAT15((0 < sVar12) * (sVar12 < 0x100) * auVar88[10]
                                                       - (0xff < sVar12),
                                                       CONCAT14((0 < sVar11) * (sVar11 < 0x100) *
                                                                auVar88[8] - (0xff < sVar11),uVar89)
                                                      ))) >> 0x20);
  if (is_nifti != 0) {
    uVar3._0_4_ = h->intent_p1;
    uVar3._4_4_ = h->intent_p2;
    auVar28._8_6_ = 0;
    auVar28._0_8_ = uVar3;
    auVar28[0xe] = (char)((uint)uVar3._4_4_ >> 0x18);
    auVar34._8_4_ = 0;
    auVar34._0_8_ = uVar3;
    auVar34[0xc] = (char)((uint)uVar3._4_4_ >> 0x10);
    auVar34._13_2_ = auVar28._13_2_;
    auVar40._8_4_ = 0;
    auVar40._0_8_ = uVar3;
    auVar40._12_3_ = auVar34._12_3_;
    auVar46._8_2_ = 0;
    auVar46._0_8_ = uVar3;
    auVar46[10] = (char)((uint)uVar3._4_4_ >> 8);
    auVar46._11_4_ = auVar40._11_4_;
    auVar52._8_2_ = 0;
    auVar52._0_8_ = uVar3;
    auVar52._10_5_ = auVar46._10_5_;
    auVar58[8] = (char)uVar3._4_4_;
    auVar58._0_8_ = uVar3;
    auVar58._9_6_ = auVar52._9_6_;
    auVar70._7_8_ = 0;
    auVar70._0_7_ = auVar58._8_7_;
    auVar77._1_8_ = SUB158(auVar70 << 0x40,7);
    auVar77[0] = (char)((uint)(undefined4)uVar3 >> 0x18);
    auVar77._9_6_ = 0;
    auVar78._1_10_ = SUB1510(auVar77 << 0x30,5);
    auVar78[0] = (char)((uint)(undefined4)uVar3 >> 0x10);
    auVar78._11_4_ = 0;
    auVar64[2] = (char)((uint)(undefined4)uVar3 >> 8);
    auVar64._0_2_ = (ushort)(undefined4)uVar3;
    auVar64._3_12_ = SUB1512(auVar78 << 0x20,3);
    auVar91._0_2_ = (ushort)(undefined4)uVar3 & 0xff;
    auVar91._2_13_ = auVar64._2_13_;
    auVar91[0xf] = 0;
    auVar88 = pshuflw(auVar91,auVar91,0x1b);
    auVar88 = pshufhw(auVar88,auVar88,0x1b);
    sVar11 = auVar88._0_2_;
    sVar12 = auVar88._2_2_;
    sVar13 = auVar88._4_2_;
    sVar14 = auVar88._6_2_;
    uVar89 = CONCAT13((0 < sVar14) * (sVar14 < 0x100) * auVar88[6] - (0xff < sVar14),
                      CONCAT12((0 < sVar13) * (sVar13 < 0x100) * auVar88[4] - (0xff < sVar13),
                               CONCAT11((0 < sVar12) * (sVar12 < 0x100) * auVar88[2] -
                                        (0xff < sVar12),
                                        (0 < sVar11) * (sVar11 < 0x100) * auVar88[0] -
                                        (0xff < sVar11))));
    sVar11 = auVar88._8_2_;
    sVar12 = auVar88._10_2_;
    sVar13 = auVar88._12_2_;
    sVar14 = auVar88._14_2_;
    h->intent_p1 = (float)uVar89;
    h->intent_p2 = (float)(int)(CONCAT17((0 < sVar14) * (sVar14 < 0x100) * auVar88[0xe] -
                                         (0xff < sVar14),
                                         CONCAT16((0 < sVar13) * (sVar13 < 0x100) * auVar88[0xc] -
                                                  (0xff < sVar13),
                                                  CONCAT15((0 < sVar12) * (sVar12 < 0x100) *
                                                           auVar88[10] - (0xff < sVar12),
                                                           CONCAT14((0 < sVar11) * (sVar11 < 0x100)
                                                                    * auVar88[8] - (0xff < sVar11),
                                                                    uVar89)))) >> 0x20);
    fVar9 = h->intent_p3;
    auVar92._8_8_ = 0;
    auVar92._0_8_ =
         (ulong)CONCAT52((int5)(CONCAT43((int)(CONCAT34((int3)(CONCAT25((short)(((uint7)(byte)((uint
                                                  )fVar9 >> 0x18) << 0x30) >> 0x28),
                                                  CONCAT14((char)((uint)fVar9 >> 0x10),fVar9)) >>
                                                  0x20),fVar9) >> 0x18),
                                         CONCAT12((char)((uint)fVar9 >> 8),SUB42(fVar9,0))) >> 0x10)
                         ,SUB42(fVar9,0)) & 0xffff00ff00ff00ff;
    auVar88 = pshuflw(auVar92,auVar92,0x1b);
    sVar11 = auVar88._0_2_;
    sVar12 = auVar88._2_2_;
    sVar13 = auVar88._4_2_;
    sVar14 = auVar88._6_2_;
    h->intent_p3 = (float)CONCAT13((0 < sVar14) * (sVar14 < 0x100) * auVar88[6] - (0xff < sVar14),
                                   CONCAT12((0 < sVar13) * (sVar13 < 0x100) * auVar88[4] -
                                            (0xff < sVar13),
                                            CONCAT11((0 < sVar12) * (sVar12 < 0x100) * auVar88[2] -
                                                     (0xff < sVar12),
                                                     (0 < sVar11) * (sVar11 < 0x100) * auVar88[0] -
                                                     (0xff < sVar11))));
    psVar1 = &h->intent_code;
    *psVar1 = *psVar1 << 8 | (ushort)*psVar1 >> 8;
    psVar1 = &h->slice_start;
    *psVar1 = *psVar1 << 8 | (ushort)*psVar1 >> 8;
    psVar1 = &h->slice_end;
    *psVar1 = *psVar1 << 8 | (ushort)*psVar1 >> 8;
    uVar4._0_4_ = h->scl_slope;
    uVar4._4_4_ = h->scl_inter;
    auVar29._8_6_ = 0;
    auVar29._0_8_ = uVar4;
    auVar29[0xe] = (char)((uint)uVar4._4_4_ >> 0x18);
    auVar35._8_4_ = 0;
    auVar35._0_8_ = uVar4;
    auVar35[0xc] = (char)((uint)uVar4._4_4_ >> 0x10);
    auVar35._13_2_ = auVar29._13_2_;
    auVar41._8_4_ = 0;
    auVar41._0_8_ = uVar4;
    auVar41._12_3_ = auVar35._12_3_;
    auVar47._8_2_ = 0;
    auVar47._0_8_ = uVar4;
    auVar47[10] = (char)((uint)uVar4._4_4_ >> 8);
    auVar47._11_4_ = auVar41._11_4_;
    auVar53._8_2_ = 0;
    auVar53._0_8_ = uVar4;
    auVar53._10_5_ = auVar47._10_5_;
    auVar59[8] = (char)uVar4._4_4_;
    auVar59._0_8_ = uVar4;
    auVar59._9_6_ = auVar53._9_6_;
    auVar71._7_8_ = 0;
    auVar71._0_7_ = auVar59._8_7_;
    auVar79._1_8_ = SUB158(auVar71 << 0x40,7);
    auVar79[0] = (char)((uint)(undefined4)uVar4 >> 0x18);
    auVar79._9_6_ = 0;
    auVar80._1_10_ = SUB1510(auVar79 << 0x30,5);
    auVar80[0] = (char)((uint)(undefined4)uVar4 >> 0x10);
    auVar80._11_4_ = 0;
    auVar65[2] = (char)((uint)(undefined4)uVar4 >> 8);
    auVar65._0_2_ = (ushort)(undefined4)uVar4;
    auVar65._3_12_ = SUB1512(auVar80 << 0x20,3);
    auVar93._0_2_ = (ushort)(undefined4)uVar4 & 0xff;
    auVar93._2_13_ = auVar65._2_13_;
    auVar93[0xf] = 0;
    auVar88 = pshuflw(auVar93,auVar93,0x1b);
    auVar88 = pshufhw(auVar88,auVar88,0x1b);
    sVar11 = auVar88._0_2_;
    sVar12 = auVar88._2_2_;
    sVar13 = auVar88._4_2_;
    sVar14 = auVar88._6_2_;
    uVar89 = CONCAT13((0 < sVar14) * (sVar14 < 0x100) * auVar88[6] - (0xff < sVar14),
                      CONCAT12((0 < sVar13) * (sVar13 < 0x100) * auVar88[4] - (0xff < sVar13),
                               CONCAT11((0 < sVar12) * (sVar12 < 0x100) * auVar88[2] -
                                        (0xff < sVar12),
                                        (0 < sVar11) * (sVar11 < 0x100) * auVar88[0] -
                                        (0xff < sVar11))));
    sVar11 = auVar88._8_2_;
    sVar12 = auVar88._10_2_;
    sVar13 = auVar88._12_2_;
    sVar14 = auVar88._14_2_;
    h->scl_slope = (float)uVar89;
    h->scl_inter = (float)(int)(CONCAT17((0 < sVar14) * (sVar14 < 0x100) * auVar88[0xe] -
                                         (0xff < sVar14),
                                         CONCAT16((0 < sVar13) * (sVar13 < 0x100) * auVar88[0xc] -
                                                  (0xff < sVar13),
                                                  CONCAT15((0 < sVar12) * (sVar12 < 0x100) *
                                                           auVar88[10] - (0xff < sVar12),
                                                           CONCAT14((0 < sVar11) * (sVar11 < 0x100)
                                                                    * auVar88[8] - (0xff < sVar11),
                                                                    uVar89)))) >> 0x20);
    uVar5._0_4_ = h->slice_duration;
    uVar5._4_4_ = h->toffset;
    auVar30._8_6_ = 0;
    auVar30._0_8_ = uVar5;
    auVar30[0xe] = (char)((uint)uVar5._4_4_ >> 0x18);
    auVar36._8_4_ = 0;
    auVar36._0_8_ = uVar5;
    auVar36[0xc] = (char)((uint)uVar5._4_4_ >> 0x10);
    auVar36._13_2_ = auVar30._13_2_;
    auVar42._8_4_ = 0;
    auVar42._0_8_ = uVar5;
    auVar42._12_3_ = auVar36._12_3_;
    auVar48._8_2_ = 0;
    auVar48._0_8_ = uVar5;
    auVar48[10] = (char)((uint)uVar5._4_4_ >> 8);
    auVar48._11_4_ = auVar42._11_4_;
    auVar54._8_2_ = 0;
    auVar54._0_8_ = uVar5;
    auVar54._10_5_ = auVar48._10_5_;
    auVar60[8] = (char)uVar5._4_4_;
    auVar60._0_8_ = uVar5;
    auVar60._9_6_ = auVar54._9_6_;
    auVar72._7_8_ = 0;
    auVar72._0_7_ = auVar60._8_7_;
    auVar81._1_8_ = SUB158(auVar72 << 0x40,7);
    auVar81[0] = (char)((uint)(undefined4)uVar5 >> 0x18);
    auVar81._9_6_ = 0;
    auVar82._1_10_ = SUB1510(auVar81 << 0x30,5);
    auVar82[0] = (char)((uint)(undefined4)uVar5 >> 0x10);
    auVar82._11_4_ = 0;
    auVar66[2] = (char)((uint)(undefined4)uVar5 >> 8);
    auVar66._0_2_ = (ushort)(undefined4)uVar5;
    auVar66._3_12_ = SUB1512(auVar82 << 0x20,3);
    auVar94._0_2_ = (ushort)(undefined4)uVar5 & 0xff;
    auVar94._2_13_ = auVar66._2_13_;
    auVar94[0xf] = 0;
    auVar88 = pshuflw(auVar94,auVar94,0x1b);
    auVar88 = pshufhw(auVar88,auVar88,0x1b);
    sVar11 = auVar88._0_2_;
    sVar12 = auVar88._2_2_;
    sVar13 = auVar88._4_2_;
    sVar14 = auVar88._6_2_;
    uVar89 = CONCAT13((0 < sVar14) * (sVar14 < 0x100) * auVar88[6] - (0xff < sVar14),
                      CONCAT12((0 < sVar13) * (sVar13 < 0x100) * auVar88[4] - (0xff < sVar13),
                               CONCAT11((0 < sVar12) * (sVar12 < 0x100) * auVar88[2] -
                                        (0xff < sVar12),
                                        (0 < sVar11) * (sVar11 < 0x100) * auVar88[0] -
                                        (0xff < sVar11))));
    sVar11 = auVar88._8_2_;
    sVar12 = auVar88._10_2_;
    sVar13 = auVar88._12_2_;
    sVar14 = auVar88._14_2_;
    h->slice_duration = (float)uVar89;
    h->toffset = (float)(int)(CONCAT17((0 < sVar14) * (sVar14 < 0x100) * auVar88[0xe] -
                                       (0xff < sVar14),
                                       CONCAT16((0 < sVar13) * (sVar13 < 0x100) * auVar88[0xc] -
                                                (0xff < sVar13),
                                                CONCAT15((0 < sVar12) * (sVar12 < 0x100) *
                                                         auVar88[10] - (0xff < sVar12),
                                                         CONCAT14((0 < sVar11) * (sVar11 < 0x100) *
                                                                  auVar88[8] - (0xff < sVar11),
                                                                  uVar89)))) >> 0x20);
    auVar7._0_2_ = h->qform_code;
    auVar7._2_2_ = h->sform_code;
    auVar7._4_4_ = h->quatern_b;
    auVar7._8_4_ = h->quatern_c;
    auVar7._12_4_ = h->quatern_d;
    auVar101[1] = 0;
    auVar101[0] = (byte)auVar7._8_4_;
    auVar101[2] = (char)((uint)auVar7._8_4_ >> 8);
    auVar101[3] = 0;
    auVar101[4] = (char)((uint)auVar7._8_4_ >> 0x10);
    auVar101[5] = 0;
    auVar101[6] = (char)((uint)auVar7._8_4_ >> 0x18);
    auVar101[7] = 0;
    auVar101[8] = (char)auVar7._12_4_;
    auVar101[9] = 0;
    auVar101[10] = (char)((uint)auVar7._12_4_ >> 8);
    auVar101[0xb] = 0;
    auVar101[0xc] = (char)((uint)auVar7._12_4_ >> 0x10);
    auVar101[0xd] = 0;
    auVar101[0xe] = (char)((uint)auVar7._12_4_ >> 0x18);
    auVar101[0xf] = 0;
    auVar88 = pshuflw(auVar101,auVar101,0x1b);
    auVar102 = pshufhw(auVar88,auVar88,0x1b);
    auVar31[0xd] = 0;
    auVar31._0_13_ = auVar7._0_13_;
    auVar31[0xe] = (char)((uint)auVar7._4_4_ >> 0x18);
    auVar37[0xc] = (char)((uint)auVar7._4_4_ >> 0x10);
    auVar37._0_12_ = auVar7._0_12_;
    auVar37._13_2_ = auVar31._13_2_;
    auVar43[0xb] = 0;
    auVar43._0_11_ = auVar7._0_11_;
    auVar43._12_3_ = auVar37._12_3_;
    auVar49[10] = (char)((uint)auVar7._4_4_ >> 8);
    auVar49._0_10_ = auVar7._0_10_;
    auVar49._11_4_ = auVar43._11_4_;
    auVar55[9] = 0;
    auVar55._0_9_ = auVar7._0_9_;
    auVar55._10_5_ = auVar49._10_5_;
    auVar61[8] = (char)auVar7._4_4_;
    auVar61._0_8_ = auVar7._0_8_;
    auVar61._9_6_ = auVar55._9_6_;
    auVar73._7_8_ = 0;
    auVar73._0_7_ = auVar61._8_7_;
    auVar83._1_8_ = SUB158(auVar73 << 0x40,7);
    auVar83[0] = (char)((ushort)auVar7._2_2_ >> 8);
    auVar83._9_6_ = 0;
    auVar84._1_10_ = SUB1510(auVar83 << 0x30,5);
    auVar84[0] = (char)auVar7._2_2_;
    auVar84._11_4_ = 0;
    auVar67[2] = (char)((ushort)auVar7._0_2_ >> 8);
    auVar67._0_2_ = auVar7._0_2_;
    auVar67._3_12_ = SUB1512(auVar84 << 0x20,3);
    auVar95._0_2_ = auVar7._0_2_ & 0xff;
    auVar95._2_13_ = auVar67._2_13_;
    auVar95[0xf] = 0;
    auVar88 = pshuflw(auVar95,auVar95,0xb1);
    auVar88 = pshufhw(auVar88,auVar88,0x1b);
    sVar11 = auVar88._0_2_;
    sVar12 = auVar88._2_2_;
    sVar13 = auVar88._4_2_;
    sVar14 = auVar88._6_2_;
    sVar15 = auVar88._8_2_;
    sVar16 = auVar88._10_2_;
    sVar17 = auVar88._12_2_;
    sVar18 = auVar88._14_2_;
    sVar19 = auVar102._0_2_;
    sVar20 = auVar102._2_2_;
    sVar21 = auVar102._4_2_;
    sVar22 = auVar102._6_2_;
    sVar23 = auVar102._8_2_;
    sVar24 = auVar102._10_2_;
    sVar25 = auVar102._12_2_;
    sVar26 = auVar102._14_2_;
    *(char *)&h->qform_code = (0 < sVar11) * (sVar11 < 0x100) * auVar88[0] - (0xff < sVar11);
    *(char *)((long)&h->qform_code + 1) =
         (0 < sVar12) * (sVar12 < 0x100) * auVar88[2] - (0xff < sVar12);
    *(char *)&h->sform_code = (0 < sVar13) * (sVar13 < 0x100) * auVar88[4] - (0xff < sVar13);
    *(char *)((long)&h->sform_code + 1) =
         (0 < sVar14) * (sVar14 < 0x100) * auVar88[6] - (0xff < sVar14);
    *(char *)&h->quatern_b = (0 < sVar15) * (sVar15 < 0x100) * auVar88[8] - (0xff < sVar15);
    *(char *)((long)&h->quatern_b + 1) =
         (0 < sVar16) * (sVar16 < 0x100) * auVar88[10] - (0xff < sVar16);
    *(char *)((long)&h->quatern_b + 2) =
         (0 < sVar17) * (sVar17 < 0x100) * auVar88[0xc] - (0xff < sVar17);
    *(char *)((long)&h->quatern_b + 3) =
         (0 < sVar18) * (sVar18 < 0x100) * auVar88[0xe] - (0xff < sVar18);
    *(char *)&h->quatern_c = (0 < sVar19) * (sVar19 < 0x100) * auVar102[0] - (0xff < sVar19);
    *(char *)((long)&h->quatern_c + 1) =
         (0 < sVar20) * (sVar20 < 0x100) * auVar102[2] - (0xff < sVar20);
    *(char *)((long)&h->quatern_c + 2) =
         (0 < sVar21) * (sVar21 < 0x100) * auVar102[4] - (0xff < sVar21);
    *(char *)((long)&h->quatern_c + 3) =
         (0 < sVar22) * (sVar22 < 0x100) * auVar102[6] - (0xff < sVar22);
    *(char *)&h->quatern_d = (0 < sVar23) * (sVar23 < 0x100) * auVar102[8] - (0xff < sVar23);
    *(char *)((long)&h->quatern_d + 1) =
         (0 < sVar24) * (sVar24 < 0x100) * auVar102[10] - (0xff < sVar24);
    *(char *)((long)&h->quatern_d + 2) =
         (0 < sVar25) * (sVar25 < 0x100) * auVar102[0xc] - (0xff < sVar25);
    *(char *)((long)&h->quatern_d + 3) =
         (0 < sVar26) * (sVar26 < 0x100) * auVar102[0xe] - (0xff < sVar26);
    uVar6._0_4_ = h->qoffset_x;
    uVar6._4_4_ = h->qoffset_y;
    auVar32._8_6_ = 0;
    auVar32._0_8_ = uVar6;
    auVar32[0xe] = (char)((uint)uVar6._4_4_ >> 0x18);
    auVar38._8_4_ = 0;
    auVar38._0_8_ = uVar6;
    auVar38[0xc] = (char)((uint)uVar6._4_4_ >> 0x10);
    auVar38._13_2_ = auVar32._13_2_;
    auVar44._8_4_ = 0;
    auVar44._0_8_ = uVar6;
    auVar44._12_3_ = auVar38._12_3_;
    auVar50._8_2_ = 0;
    auVar50._0_8_ = uVar6;
    auVar50[10] = (char)((uint)uVar6._4_4_ >> 8);
    auVar50._11_4_ = auVar44._11_4_;
    auVar56._8_2_ = 0;
    auVar56._0_8_ = uVar6;
    auVar56._10_5_ = auVar50._10_5_;
    auVar62[8] = (char)uVar6._4_4_;
    auVar62._0_8_ = uVar6;
    auVar62._9_6_ = auVar56._9_6_;
    auVar74._7_8_ = 0;
    auVar74._0_7_ = auVar62._8_7_;
    auVar85._1_8_ = SUB158(auVar74 << 0x40,7);
    auVar85[0] = (char)((uint)(undefined4)uVar6 >> 0x18);
    auVar85._9_6_ = 0;
    auVar86._1_10_ = SUB1510(auVar85 << 0x30,5);
    auVar86[0] = (char)((uint)(undefined4)uVar6 >> 0x10);
    auVar86._11_4_ = 0;
    auVar68[2] = (char)((uint)(undefined4)uVar6 >> 8);
    auVar68._0_2_ = (ushort)(undefined4)uVar6;
    auVar68._3_12_ = SUB1512(auVar86 << 0x20,3);
    auVar96._0_2_ = (ushort)(undefined4)uVar6 & 0xff;
    auVar96._2_13_ = auVar68._2_13_;
    auVar96[0xf] = 0;
    auVar88 = pshuflw(auVar96,auVar96,0x1b);
    auVar88 = pshufhw(auVar88,auVar88,0x1b);
    sVar11 = auVar88._0_2_;
    sVar12 = auVar88._2_2_;
    sVar13 = auVar88._4_2_;
    sVar14 = auVar88._6_2_;
    uVar89 = CONCAT13((0 < sVar14) * (sVar14 < 0x100) * auVar88[6] - (0xff < sVar14),
                      CONCAT12((0 < sVar13) * (sVar13 < 0x100) * auVar88[4] - (0xff < sVar13),
                               CONCAT11((0 < sVar12) * (sVar12 < 0x100) * auVar88[2] -
                                        (0xff < sVar12),
                                        (0 < sVar11) * (sVar11 < 0x100) * auVar88[0] -
                                        (0xff < sVar11))));
    sVar11 = auVar88._8_2_;
    sVar12 = auVar88._10_2_;
    sVar13 = auVar88._12_2_;
    sVar14 = auVar88._14_2_;
    h->qoffset_x = (float)uVar89;
    h->qoffset_y = (float)(int)(CONCAT17((0 < sVar14) * (sVar14 < 0x100) * auVar88[0xe] -
                                         (0xff < sVar14),
                                         CONCAT16((0 < sVar13) * (sVar13 < 0x100) * auVar88[0xc] -
                                                  (0xff < sVar13),
                                                  CONCAT15((0 < sVar12) * (sVar12 < 0x100) *
                                                           auVar88[10] - (0xff < sVar12),
                                                           CONCAT14((0 < sVar11) * (sVar11 < 0x100)
                                                                    * auVar88[8] - (0xff < sVar11),
                                                                    uVar89)))) >> 0x20);
    fVar9 = h->qoffset_z;
    auVar97._8_8_ = 0;
    auVar97._0_8_ =
         (ulong)CONCAT52((int5)(CONCAT43((int)(CONCAT34((int3)(CONCAT25((short)(((uint7)(byte)((uint
                                                  )fVar9 >> 0x18) << 0x30) >> 0x28),
                                                  CONCAT14((char)((uint)fVar9 >> 0x10),fVar9)) >>
                                                  0x20),fVar9) >> 0x18),
                                         CONCAT12((char)((uint)fVar9 >> 8),SUB42(fVar9,0))) >> 0x10)
                         ,SUB42(fVar9,0)) & 0xffff00ff00ff00ff;
    auVar88 = pshuflw(auVar97,auVar97,0x1b);
    sVar11 = auVar88._0_2_;
    sVar12 = auVar88._2_2_;
    sVar13 = auVar88._4_2_;
    sVar14 = auVar88._6_2_;
    h->qoffset_z = (float)CONCAT13((0 < sVar14) * (sVar14 < 0x100) * auVar88[6] - (0xff < sVar14),
                                   CONCAT12((0 < sVar13) * (sVar13 < 0x100) * auVar88[4] -
                                            (0xff < sVar13),
                                            CONCAT11((0 < sVar12) * (sVar12 < 0x100) * auVar88[2] -
                                                     (0xff < sVar12),
                                                     (0 < sVar11) * (sVar11 < 0x100) * auVar88[0] -
                                                     (0xff < sVar11))));
    lVar87 = 0;
    do {
      fVar9 = h->srow_x[lVar87];
      auVar98._8_8_ = 0;
      auVar98._0_8_ =
           (ulong)CONCAT52((int5)(CONCAT43((int)(CONCAT34((int3)(CONCAT25((short)(((uint7)(byte)((
                                                  uint)fVar9 >> 0x18) << 0x30) >> 0x28),
                                                  CONCAT14((char)((uint)fVar9 >> 0x10),fVar9)) >>
                                                  0x20),fVar9) >> 0x18),
                                           CONCAT12((char)((uint)fVar9 >> 8),SUB42(fVar9,0))) >>
                                 0x10),SUB42(fVar9,0)) & 0xffff00ff00ff00ff;
      auVar88 = pshuflw(auVar98,auVar98,0x1b);
      sVar11 = auVar88._0_2_;
      sVar12 = auVar88._2_2_;
      sVar13 = auVar88._4_2_;
      sVar14 = auVar88._6_2_;
      h->srow_x[lVar87] =
           (float)CONCAT13((0 < sVar14) * (sVar14 < 0x100) * auVar88[6] - (0xff < sVar14),
                           CONCAT12((0 < sVar13) * (sVar13 < 0x100) * auVar88[4] - (0xff < sVar13),
                                    CONCAT11((0 < sVar12) * (sVar12 < 0x100) * auVar88[2] -
                                             (0xff < sVar12),
                                             (0 < sVar11) * (sVar11 < 0x100) * auVar88[0] -
                                             (0xff < sVar11))));
      lVar87 = lVar87 + 1;
    } while (lVar87 != 4);
    lVar87 = 0;
    do {
      fVar9 = h->srow_y[lVar87];
      auVar99._8_8_ = 0;
      auVar99._0_8_ =
           (ulong)CONCAT52((int5)(CONCAT43((int)(CONCAT34((int3)(CONCAT25((short)(((uint7)(byte)((
                                                  uint)fVar9 >> 0x18) << 0x30) >> 0x28),
                                                  CONCAT14((char)((uint)fVar9 >> 0x10),fVar9)) >>
                                                  0x20),fVar9) >> 0x18),
                                           CONCAT12((char)((uint)fVar9 >> 8),SUB42(fVar9,0))) >>
                                 0x10),SUB42(fVar9,0)) & 0xffff00ff00ff00ff;
      auVar88 = pshuflw(auVar99,auVar99,0x1b);
      sVar11 = auVar88._0_2_;
      sVar12 = auVar88._2_2_;
      sVar13 = auVar88._4_2_;
      sVar14 = auVar88._6_2_;
      h->srow_y[lVar87] =
           (float)CONCAT13((0 < sVar14) * (sVar14 < 0x100) * auVar88[6] - (0xff < sVar14),
                           CONCAT12((0 < sVar13) * (sVar13 < 0x100) * auVar88[4] - (0xff < sVar13),
                                    CONCAT11((0 < sVar12) * (sVar12 < 0x100) * auVar88[2] -
                                             (0xff < sVar12),
                                             (0 < sVar11) * (sVar11 < 0x100) * auVar88[0] -
                                             (0xff < sVar11))));
      lVar87 = lVar87 + 1;
    } while (lVar87 != 4);
    lVar87 = 0;
    do {
      fVar9 = h->srow_z[lVar87];
      auVar100._8_8_ = 0;
      auVar100._0_8_ =
           (ulong)CONCAT52((int5)(CONCAT43((int)(CONCAT34((int3)(CONCAT25((short)(((uint7)(byte)((
                                                  uint)fVar9 >> 0x18) << 0x30) >> 0x28),
                                                  CONCAT14((char)((uint)fVar9 >> 0x10),fVar9)) >>
                                                  0x20),fVar9) >> 0x18),
                                           CONCAT12((char)((uint)fVar9 >> 8),SUB42(fVar9,0))) >>
                                 0x10),SUB42(fVar9,0)) & 0xffff00ff00ff00ff;
      auVar88 = pshuflw(auVar100,auVar100,0x1b);
      sVar11 = auVar88._0_2_;
      sVar12 = auVar88._2_2_;
      sVar13 = auVar88._4_2_;
      sVar14 = auVar88._6_2_;
      h->srow_z[lVar87] =
           (float)CONCAT13((0 < sVar14) * (sVar14 < 0x100) * auVar88[6] - (0xff < sVar14),
                           CONCAT12((0 < sVar13) * (sVar13 < 0x100) * auVar88[4] - (0xff < sVar13),
                                    CONCAT11((0 < sVar12) * (sVar12 < 0x100) * auVar88[2] -
                                             (0xff < sVar12),
                                             (0 < sVar11) * (sVar11 < 0x100) * auVar88[0] -
                                             (0xff < sVar11))));
      lVar87 = lVar87 + 1;
    } while (lVar87 != 4);
  }
  return;
}

Assistant:

void nifti_swap_4bytes( size_t n , void *ar )    /* 4 bytes at a time */
{
   register size_t ii ;
   unsigned char * cp0 = (unsigned char *)ar, * cp1, * cp2 ;
   register unsigned char tval ;

   for( ii=0 ; ii < n ; ii++ ){
       cp1 = cp0; cp2 = cp0+3;
       tval = *cp1;  *cp1 = *cp2;  *cp2 = tval;
       cp1++;  cp2--;
       tval = *cp1;  *cp1 = *cp2;  *cp2 = tval;
       cp0 += 4;
   }
   return ;
}